

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

MultipleConcatenationExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::MultipleConcatenationExpressionSyntax,slang::parsing::Token&,slang::syntax::ExpressionSyntax&,slang::syntax::ConcatenationExpressionSyntax&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,ExpressionSyntax *args_1,
          ConcatenationExpressionSyntax *args_2,Token *args_3)

{
  Token closeBrace;
  ConcatenationExpressionSyntax *concatenation;
  undefined8 in_RCX;
  Info *in_RDX;
  Token *in_RSI;
  undefined8 *in_R8;
  size_t in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb0;
  BumpAllocator *in_stack_ffffffffffffffb8;
  
  concatenation =
       (ConcatenationExpressionSyntax *)
       allocate(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  closeBrace.info = in_RDX;
  closeBrace.kind = (short)in_RCX;
  closeBrace._2_1_ = (char)((ulong)in_RCX >> 0x10);
  closeBrace.numFlags.raw = (char)((ulong)in_RCX >> 0x18);
  closeBrace.rawLen = (int)((ulong)in_RCX >> 0x20);
  slang::syntax::MultipleConcatenationExpressionSyntax::MultipleConcatenationExpressionSyntax
            ((MultipleConcatenationExpressionSyntax *)in_R8[1],*in_RSI,(ExpressionSyntax *)*in_R8,
             concatenation,closeBrace);
  return (MultipleConcatenationExpressionSyntax *)concatenation;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }